

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::cpp::UInt64ToString
                   (string *__return_storage_ptr__,string *macro_prefix,uint64 number)

{
  AlphaNum *in_R9;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  pointer local_50;
  size_type local_48;
  
  local_50 = (macro_prefix->_M_dataplus)._M_p;
  local_48 = macro_prefix->_M_string_length;
  local_80.piece_data_ = "_ULONGLONG(";
  local_80.piece_size_ = 0xb;
  strings::AlphaNum::AlphaNum(&local_b0,number);
  local_e0.piece_data_ = ")";
  local_e0.piece_size_ = 1;
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_50,&local_80,&local_b0,&local_e0,in_R9
                   );
  return __return_storage_ptr__;
}

Assistant:

std::string UInt64ToString(const std::string& macro_prefix, uint64 number) {
  return StrCat(macro_prefix, "_ULONGLONG(", number, ")");
}